

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O0

wchar_t curses_display_menu_core
                  (nh_menuitem_conflict *items,wchar_t icount,char *title,wchar_t how,
                  wchar_t *results,wchar_t x1,wchar_t y1,wchar_t x2,wchar_t y2,
                  _func_nh_bool_win_menu_ptr_wchar_t *changefn,nh_bool start_at_bottom)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  nh_bool nVar4;
  undefined4 uVar5;
  wchar_t wVar6;
  gamewin *gw_00;
  win_menu *mdat_00;
  WINDOW_conflict *pWVar7;
  char *pcVar8;
  wchar_t local_194;
  wchar_t local_190;
  int local_18c;
  int local_180;
  char local_178 [4];
  wchar_t end;
  char sbuf [256];
  nh_bool cancelled;
  nh_bool done;
  wchar_t prev_offset;
  wchar_t prevcurs;
  wchar_t starty;
  wchar_t startx;
  wchar_t rv;
  wchar_t idx;
  wchar_t key;
  wchar_t i;
  win_menu *mdat;
  gamewin *gw;
  wchar_t x1_local;
  wchar_t *results_local;
  wchar_t how_local;
  char *title_local;
  wchar_t icount_local;
  nh_menuitem_conflict *items_local;
  
  uVar5 = curs_set(0);
  gw_00 = alloc_gamewin(L'\x98');
  gw_00->draw = draw_menu;
  gw_00->resize = resize_menu;
  mdat_00 = (win_menu *)(gw_00 + 1);
  gw_00[1].resize = (_func_void_gamewin_ptr *)items;
  *(wchar_t *)&gw_00[1].prev = icount;
  gw_00[1].next = (gamewin *)title;
  *(wchar_t *)((long)&gw_00[1].prev + 4) = how;
  pWVar7 = (WINDOW_conflict *)calloc((long)icount,1);
  gw_00[1].win = pWVar7;
  *(wchar_t *)((long)&gw_00[4].resize + 4) = x1;
  *(wchar_t *)&gw_00[4].win = y1;
  *(wchar_t *)((long)&gw_00[4].win + 4) = x2;
  *(wchar_t *)&gw_00[4].next = y2;
  gw._4_4_ = x1;
  if (x1 < L'\0') {
    gw._4_4_ = L'\0';
  }
  if (y1 < L'\0') {
    y1 = L'\0';
  }
  if (x2 < L'\0') {
    x2 = _COLS;
  }
  if (y2 < L'\0') {
    y2 = _LINES;
  }
  assign_menu_accelerators(mdat_00);
  layout_menu(gw_00);
  if (start_at_bottom != '\0') {
    if (*(int *)&gw_00[1].prev - *(int *)((long)&gw_00[2].resize + 4) < 1) {
      local_180 = 0;
    }
    else {
      local_180 = *(int *)&gw_00[1].prev - *(int *)((long)&gw_00[2].resize + 4);
    }
    *(int *)&gw_00[2].draw = local_180;
  }
  pWVar7 = (WINDOW_conflict *)
           newwin(*(undefined4 *)((long)&gw_00[2].draw + 4),*(undefined4 *)&gw_00[2].win,
                  ((y2 - y1) - *(int *)((long)&gw_00[2].draw + 4)) / 2 + y1,
                  ((x2 - gw._4_4_) - *(int *)&gw_00[2].win) / 2 + gw._4_4_);
  gw_00->win = pWVar7;
  keypad(gw_00->win,1);
  nh_box_wborder((WINDOW *)gw_00->win,0x600);
  pWVar7 = (WINDOW_conflict *)
           derwin(gw_00->win,*(undefined4 *)((long)&gw_00[2].resize + 4),
                  *(undefined4 *)((long)&gw_00[2].win + 4),*(int *)&gw_00[2].resize + -1,2);
  mdat_00->content = pWVar7;
  leaveok(gw_00->win,1);
  leaveok(mdat_00->content,1);
  bVar2 = false;
  bVar3 = false;
LAB_0010fa0f:
  do {
    while( true ) {
      if (bVar2 || bVar3) {
        delwin(mdat_00->content);
        delwin(gw_00->win);
        if (bVar3) {
          starty = L'\xffffffff';
        }
        else {
          starty = L'\0';
          for (idx = L'\0'; idx < icount; idx = idx + L'\x01') {
            if (*(char *)((long)((gw_00[1].win)->_bkgrnd).chars + (long)idx + -0x5c) != '\0') {
              if (results != (wchar_t *)0x0) {
                results[starty] = items[idx].id;
              }
              starty = starty + L'\x01';
            }
          }
        }
        free(gw_00[1].win);
        delete_gamewin(gw_00);
        redraw_game_windows();
        curs_set(uVar5);
        return starty;
      }
      draw_menu(gw_00);
      wVar6 = nh_wgetch(gw_00->win);
      if (wVar6 != L'\r') break;
LAB_0010fcb7:
      bVar2 = true;
    }
    if (wVar6 == L'\x1b') {
      bVar3 = true;
      goto LAB_0010fa0f;
    }
    if (wVar6 == L' ') {
LAB_0010fbf5:
      iVar1 = *(int *)&gw_00[2].draw;
      *(int *)&gw_00[2].draw = *(int *)((long)&gw_00[2].resize + 4) + *(int *)&gw_00[2].draw;
      if (*(int *)&gw_00[1].prev - *(int *)((long)&gw_00[2].resize + 4) < *(int *)&gw_00[2].draw) {
        *(int *)&gw_00[2].draw = *(int *)&gw_00[1].prev - *(int *)((long)&gw_00[2].resize + 4);
      }
      if ((wVar6 == L' ') && (*(int *)&gw_00[2].draw == iVar1)) {
        bVar2 = true;
      }
      goto LAB_0010fa0f;
    }
    if (wVar6 != L'-') {
      if (wVar6 != L'.') {
        if (wVar6 == L':') {
          curses_getline("Search:",local_178);
          idx = L'\0';
          while ((idx < icount &&
                 (pcVar8 = strstr((char *)(gw_00[1].resize + (long)idx * 0x10c + 8),local_178),
                 pcVar8 == (char *)0x0))) {
            idx = idx + L'\x01';
          }
          if (idx < icount) {
            if (*(int *)&gw_00[1].prev - *(int *)((long)&gw_00[2].resize + 4) < 1) {
              local_190 = L'\0';
            }
            else {
              local_190 = *(int *)&gw_00[1].prev - *(int *)((long)&gw_00[2].resize + 4);
            }
            if (idx < local_190) {
              local_194 = idx;
            }
            else {
              local_194 = local_190;
            }
            *(wchar_t *)&gw_00[2].draw = local_194;
          }
          goto LAB_0010fa0f;
        }
        if (wVar6 == L'<') {
LAB_0010fbc8:
          *(int *)&gw_00[2].draw = *(int *)&gw_00[2].draw - *(int *)((long)&gw_00[2].resize + 4);
          if (*(int *)&gw_00[2].draw < 0) {
            *(undefined4 *)&gw_00[2].draw = 0;
          }
          goto LAB_0010fa0f;
        }
        if (wVar6 == L'>') goto LAB_0010fbf5;
        if (wVar6 == L'^') {
LAB_0010fc59:
          *(undefined4 *)&gw_00[2].draw = 0;
          goto LAB_0010fa0f;
        }
        if (wVar6 != L'|') {
          if (wVar6 == L'Ă') {
            if (*(int *)&gw_00[2].draw <
                *(int *)&gw_00[1].prev - *(int *)((long)&gw_00[2].resize + 4)) {
              *(int *)&gw_00[2].draw = *(int *)&gw_00[2].draw + 1;
            }
            goto LAB_0010fa0f;
          }
          if (wVar6 == L'ă') {
            if (0 < *(int *)&gw_00[2].draw) {
              *(int *)&gw_00[2].draw = *(int *)&gw_00[2].draw + -1;
            }
            goto LAB_0010fa0f;
          }
          if (wVar6 == L'Ć') goto LAB_0010fc59;
          if (wVar6 == L'Œ') goto LAB_0010fbf5;
          if (wVar6 == L'œ') goto LAB_0010fbc8;
          if (wVar6 == L'ŗ') goto LAB_0010fcb7;
          if (wVar6 != L'Ũ') {
            wVar6 = find_accel(wVar6,mdat_00);
            if ((wVar6 != L'\xffffffff') &&
               (((changefn == (_func_nh_bool_win_menu_ptr_wchar_t *)0x0 ||
                 (nVar4 = (*changefn)(mdat_00,wVar6), nVar4 != '\0')) &&
                (*(byte *)((long)((gw_00[1].win)->_bkgrnd).chars + (long)wVar6 + -0x5c) =
                      (*(char *)((long)((gw_00[1].win)->_bkgrnd).chars + (long)wVar6 + -0x5c) !=
                       '\0' ^ 0xffU) & 1, *(int *)((long)&gw_00[1].prev + 4) == 1)))) {
              bVar2 = true;
            }
            goto LAB_0010fa0f;
          }
        }
        if (*(int *)&gw_00[1].prev - *(int *)((long)&gw_00[2].resize + 4) < 1) {
          local_18c = 0;
        }
        else {
          local_18c = *(int *)&gw_00[1].prev - *(int *)((long)&gw_00[2].resize + 4);
        }
        *(int *)&gw_00[2].draw = local_18c;
        goto LAB_0010fa0f;
      }
      if (*(int *)((long)&gw_00[1].prev + 4) == 2) {
        for (idx = L'\0'; idx < icount; idx = idx + L'\x01') {
          if (*(int *)(gw_00[1].resize + (long)idx * 0x10c + 4) == 1) {
            *(undefined1 *)((long)((gw_00[1].win)->_bkgrnd).chars + (long)idx + -0x5c) = 1;
          }
        }
      }
      goto LAB_0010fa0f;
    }
    for (idx = L'\0'; idx < icount; idx = idx + L'\x01') {
      *(undefined1 *)((long)((gw_00[1].win)->_bkgrnd).chars + (long)idx + -0x5c) = 0;
    }
  } while( true );
}

Assistant:

int curses_display_menu_core(struct nh_menuitem *items, int icount,
			     const char *title, int how, int *results,
			     int x1, int y1, int x2, int y2,
			     nh_bool (*changefn)(struct win_menu*, int),
			     nh_bool start_at_bottom)
{
    struct gamewin *gw;
    struct win_menu *mdat;
    int i, key, idx, rv, startx, starty, prevcurs, prev_offset;
    nh_bool done, cancelled;
    char sbuf[BUFSZ];
    
    prevcurs = curs_set(0);
    
    gw = alloc_gamewin(sizeof(struct win_menu));
    gw->draw = draw_menu;
    gw->resize = resize_menu;
    mdat = (struct win_menu*)gw->extra;
    mdat->items = items;
    mdat->icount = icount;
    mdat->title = title;
    mdat->how = how;
    mdat->selected = calloc(icount, sizeof(nh_bool));
    mdat->x1 = x1; mdat->y1 = y1; mdat->x2 = x2; mdat->y2 = y2;
    
    if (x1 < 0) x1 = 0;
    if (y1 < 0) y1 = 0;
    if (x2 < 0) x2 = COLS;
    if (y2 < 0) y2 = LINES;
    
    assign_menu_accelerators(mdat);
    layout_menu(gw);

    if (start_at_bottom)
	mdat->offset = max(mdat->icount - mdat->innerheight, 0);

    starty = (y2 - y1 - mdat->height) / 2 + y1;
    startx = (x2 - x1 - mdat->width) / 2 + x1;
    
    gw->win = newwin(mdat->height, mdat->width, starty, startx);
    keypad(gw->win, TRUE);
    nh_box_wborder(gw->win, FRAME_ATTRS);
    mdat->content = derwin(gw->win, mdat->innerheight, mdat->innerwidth,
			   mdat->frameheight-1, 2);
    leaveok(gw->win, TRUE);
    leaveok(mdat->content, TRUE);
    done = FALSE;
    cancelled = FALSE;
    while (!done && !cancelled) {
	draw_menu(gw);
	
	key = nh_wgetch(gw->win);
	
	switch (key) {
	    /* one line up */
	    case KEY_UP:
		if (mdat->offset > 0)
		    mdat->offset--;
		break;
		
	    /* one line down */
	    case KEY_DOWN:
		if (mdat->offset < mdat->icount - mdat->innerheight)
		    mdat->offset++;
		break;
	    
	    /* page up */
	    case KEY_PPAGE:
	    case '<':
		mdat->offset -= mdat->innerheight;
		if (mdat->offset < 0)
		    mdat->offset = 0;
		break;
	    
	    /* page down */
	    case KEY_NPAGE:
	    case '>':
	    case ' ':
		prev_offset = mdat->offset;
		mdat->offset += mdat->innerheight;
		if (mdat->offset > mdat->icount - mdat->innerheight)
		    mdat->offset = mdat->icount - mdat->innerheight;
		if (key == ' ' && mdat->offset == prev_offset)
		    done = TRUE;
		break;
		
	    /* go to the top */
	    case KEY_HOME:
	    case '^':
		mdat->offset = 0;
		break;
		
	    /* go to the end */
	    case KEY_END:
	    case '|':
		mdat->offset = max(mdat->icount - mdat->innerheight, 0);
		break;
		
	    /* cancel */
	    case KEY_ESC:
		cancelled = TRUE;
		break;
		
	    /* confirm */
	    case KEY_ENTER:
	    case '\r':
		done = TRUE;
		break;
		
	    /* select all */
	    case '.':
		if (mdat->how == PICK_ANY)
		    for (i = 0; i < icount; i++)
			if (mdat->items[i].role == MI_NORMAL)
			    mdat->selected[i] = TRUE;
		break;
		
	    /* select none */
	    case '-':
		for (i = 0; i < icount; i++)
		    mdat->selected[i] = FALSE;
		break;
		
	    /* search for a menu item */
	    case ':':
		curses_getline("Search:", sbuf);
		for (i = 0; i < icount; i++)
		    if (strstr(mdat->items[i].caption, sbuf))
			break;
		if (i < icount) {
		    int end = max(mdat->icount - mdat->innerheight, 0);
		    mdat->offset = min(i, end);
		}
		break;
		
	    /* try to find an item for this key and, if one is found, select it */
	    default:
		idx = find_accel(key, mdat);
		
		if (idx != -1 && /* valid accelerator */
		    (!changefn || changefn(mdat, idx))) {
		    mdat->selected[idx] = !mdat->selected[idx];
		    
		    if (mdat->how == PICK_ONE)
			done = TRUE;
		}
		break;
	}
    }
    
    delwin(mdat->content);
    delwin(gw->win);
    
    if (cancelled)
	rv = -1;
    else {
	rv = 0;
	for (i = 0; i < icount; i++) {
	    if (mdat->selected[i]) {
		if (results)
		    results[rv] = items[i].id;
		rv++;
	    }
	}
    }
    
    free(mdat->selected);
    delete_gamewin(gw);    
    redraw_game_windows();
    curs_set(prevcurs);
	
    return rv;
}